

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddef.cpp
# Opt level: O1

void sdInit(void)

{
  uchar *__dest;
  size_t __n;
  int iVar1;
  uchar *puVar2;
  long *plVar3;
  int *piVar4;
  int *__s;
  char (*pacVar5) [256];
  int i;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int i_1;
  char (*__dest_00) [32];
  long lVar9;
  long lVar10;
  char s [256];
  char local_138 [264];
  
  plVar3 = (long *)operator_new__(0x1b2d7);
  __dest_00 = patchnames;
  lVar9 = 0;
  uVar6 = 0;
  soundmem = (uchar *)plVar3;
  patchoffsets = plVar3;
  do {
    __dest = (uchar *)((long)plVar3 + lVar9 + 0x200);
    puVar2 = __dest;
    if (lVar9 != 0x1ab80) {
      patchoffsets[uVar6] = (long)__dest - (long)soundmem;
      sprintf(local_138,"Init Patch #%03d",uVar6 & 0xffffffff);
      strcpy(*__dest_00,local_138);
      puVar2 = editmem;
    }
    editmem = puVar2;
    memcpy(__dest,"@@\x01",0x357);
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 0x357;
    __dest_00 = __dest_00 + 1;
  } while (lVar9 != 0x1aed7);
  builtin_strncpy(globals,"@@ \x7fdP@@",9);
  globals[9] = '\0';
  globals[10] = '@';
  globals[0xb] = '\0';
  globals[0xc] = '\x7f';
  globals[0xd] = '\0';
  globals[0xe] = '\0';
  globals[0xf] = '\x01';
  globals[0x10] = '\x02';
  globals[0x11] = 'Z';
  globals[0x12] = ' ';
  globals[0x13] = '\x14';
  globals[0x14] = '@';
  globals[0x15] = '@';
  globals[0x16] = '\0';
  memcpy(v2clipboard,"@@\x01",0x357);
  builtin_strncpy(v2clipname,"Init Patch",0xb);
  v2version = 0;
  lVar9 = 0;
  iVar7 = 0;
  do {
    iVar1 = *(int *)((long)&v2parms[0].version + lVar9);
    if (iVar7 < iVar1) {
      iVar7 = iVar1;
      v2version = iVar1;
    }
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x10b0);
  lVar9 = 0;
  iVar7 = v2version;
  do {
    iVar1 = *(int *)((long)&v2gparms[0].version + lVar9);
    if (iVar7 < iVar1) {
      iVar7 = iVar1;
      v2version = iVar1;
    }
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x450);
  __n = (long)v2version * 4 + 4;
  uVar6 = 0xffffffffffffffff;
  if (-2 < (long)v2version) {
    uVar6 = __n;
  }
  piVar4 = (int *)operator_new__(uVar6);
  v2vsizes = piVar4;
  __s = (int *)operator_new__(uVar6);
  lVar10 = 0;
  v2gsizes = __s;
  memset(piVar4,0,__n);
  memset(__s,0,__n);
  iVar7 = v2version;
  lVar9 = (long)v2version;
  do {
    iVar1 = v2parms[lVar10].version;
    lVar8 = lVar9 + 1;
    if (iVar1 <= iVar7) {
      do {
        piVar4[lVar8 + -1] = piVar4[lVar8 + -1] + 1;
        lVar8 = lVar8 + -1;
      } while (iVar1 < lVar8);
    }
    iVar1 = v2version;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x59);
  lVar9 = (long)v2version;
  lVar10 = 0;
  do {
    iVar7 = v2gparms[lVar10].version;
    lVar8 = lVar9 + 1;
    if (iVar7 <= iVar1) {
      do {
        __s[lVar8 + -1] = __s[lVar8 + -1] + 1;
        lVar8 = lVar8 + -1;
      } while (iVar7 < lVar8);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x17);
  uVar6 = (ulong)(uint)v2version;
  if (-1 < v2version) {
    lVar9 = 0;
    do {
      piVar4[lVar9] = piVar4[lVar9] + 0x2fe;
      lVar9 = lVar9 + 1;
    } while (uVar6 + 1 != lVar9);
  }
  piVar4 = (int *)operator_new__(0x44);
  lVar9 = 0;
  iVar7 = 0;
  v2topics2 = piVar4;
  do {
    *piVar4 = iVar7;
    iVar7 = iVar7 + *(int *)((long)&v2topics[0].no + lVar9);
    lVar9 = lVar9 + 0x18;
    piVar4 = piVar4 + 1;
  } while (lVar9 != 0x198);
  piVar4 = (int *)operator_new__(0x14);
  lVar9 = 0;
  iVar7 = 0;
  v2gtopics2 = piVar4;
  do {
    *piVar4 = iVar7;
    iVar7 = iVar7 + *(int *)((long)&v2gtopics[0].no + lVar9);
    lVar9 = lVar9 + 0x18;
    piVar4 = piVar4 + 1;
  } while (lVar9 != 0x78);
  pacVar5 = speech;
  lVar9 = 0;
  memset(speech,0,0x4000);
  do {
    speechptrs[lVar9] = *pacVar5;
    lVar9 = lVar9 + 1;
    pacVar5 = pacVar5 + 1;
  } while (lVar9 != 0x40);
  memcpy(speech,"!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ",0x4d)
  ;
  return;
}

Assistant:

void sdInit()
{
    soundmem = new unsigned char [smsize + v2soundsize];
    patchoffsets = (long *)soundmem;
    unsigned char *sptr = soundmem + 128*4;

    // printf("sound size: %d\n",v2nparms);
    char s[256];

    for (int i = 0; i < 129; i++)
    {
        if (i < 128)
        {
            patchoffsets[i] = (long)(sptr - soundmem);
            sprintf(s, "Init Patch #%03d", i);
            strcpy(patchnames[i], s);
        } else
            editmem = sptr;
        memcpy(sptr, v2initsnd, v2soundsize);
        sptr += v2soundsize;
    }
    for (int i = 0; i < v2ngparms; i++)
        globals[i] = v2initglobs[i];

    memcpy(v2clipboard, v2initsnd, v2soundsize);
    sprintf(v2clipname, "Init Patch");

    // init version control
    v2version = 0;
    for (int i = 0; i < v2nparms; i++)
        if (v2parms[i].version > v2version)
            v2version = v2parms[i].version;
    for (int i = 0; i < v2ngparms; i++)
        if (v2gparms[i].version > v2version)
            v2version = v2gparms[i].version;

    v2vsizes = new int[v2version + 1];
    v2gsizes = new int[v2version + 1];
    memset(v2vsizes, 0, (v2version + 1)*sizeof(int));
    memset(v2gsizes, 0, (v2version + 1)*sizeof(int));
    for (int i = 0; i < v2nparms; i++)
    {
        const V2PARAM &p = v2parms[i];
//        ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2vsizes[j]++;
    }
    for (int i = 0; i < v2ngparms; i++)
    {
        const V2PARAM &p = v2gparms[i];
        //ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2gsizes[j]++;
    }
//ATLASSERT(v2vsizes[v2version]==v2nparms);

    for (int i = 0; i <= v2version; i++)
    {
        // printf("size of version %d sound bank: %d params, %d globals\n",i,v2vsizes[i],v2gsizes[i]);
        v2vsizes[i] += 1 + 255*3;
    }

    v2topics2 = new int[v2ntopics];
    int p = 0;
    for (int i = 0; i < v2ntopics; i++)
    {
        v2topics2[i] = p;
        p += v2topics[i].no;
    }

    v2gtopics2 = new int[v2ngtopics];
    p = 0;
    for (int i = 0; i < v2ngtopics; i++)
    {
        v2gtopics2[i] = p;
        p += v2gtopics[i].no;
    }

#ifdef RONAN
    memset(speech, 0, 64*256);
    for (int i = 0; i < 64; i++)
        speechptrs[i] = speech[i];

    strcpy(speech[0], "!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ");
#endif
}